

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O2

void am_new_points_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,
               Am_Object *new_obj_proto,Am_Value *new_loc)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Object *this;
  Am_Object new_object;
  Am_Object orig_object;
  Am_Object owner;
  Am_Object impl_parent;
  Am_Object inter;
  Am_Inter_Location data;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  inter.data = (Am_Object_Data *)0x0;
  new_object.data = (Am_Object_Data *)0x0;
  owner.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&inter,pAVar5);
  pAVar5 = Am_Object::Get(command_obj,0x169,0);
  Am_Object::operator=(&new_object,pAVar5);
  pAVar5 = Am_Object::Get(command_obj,0x16f,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
  if (bVar1) {
    bVar2 = Am_Object::Valid(&new_object);
    bVar3 = true;
    if (bVar2) {
      pAVar5 = Am_Object::Get(command_obj,0x171,0);
      Am_Object::operator=(&owner,pAVar5);
      bVar2 = Am_Object::Valid(&owner);
      if (bVar2) {
        this = &local_38;
        Am_Object::Am_Object(this,&new_object);
        Am_Object::Add_Part(&owner,this,true,0);
LAB_001c7447:
        Am_Object::~Am_Object(this);
        bVar3 = bVar1;
      }
    }
  }
  else {
    if (undo) {
      bVar3 = Am_Object::Valid(&new_object);
      if (bVar3) {
        Am_Object::Get_Owner(&orig_object,(Am_Slot_Flags)&new_object);
        Am_Object::operator=(&owner,&orig_object);
        Am_Object::~Am_Object(&orig_object);
        pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
        Am_Object::Set(command_obj,0x171,pAVar6,1);
        this = &local_40;
        Am_Object::Am_Object(this,&new_object);
        Am_Object::Remove_Part(&owner,this);
        goto LAB_001c7447;
      }
    }
    else {
      bVar1 = Am_Object::Valid(&inter);
      if (bVar1) {
        orig_object.data = (Am_Object_Data *)0x0;
        impl_parent.data = (Am_Object_Data *)0x0;
        if ((reload_data) && (bVar1 = Am_Object::Valid(new_obj_proto), bVar1)) {
          Am_Object::operator=(&orig_object,new_obj_proto);
          pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&orig_object);
          Am_Object::Set(command_obj,0x11a,pAVar6,1);
        }
        else {
          pAVar5 = Am_Object::Get(command_obj,0x11a,0);
          Am_Object::operator=(&orig_object,pAVar5);
        }
        bVar1 = Am_Object::Valid(&orig_object);
        if (bVar1) {
          Am_Inter_Location::Am_Inter_Location(&data,&orig_object);
          if ((reload_data) && (bVar1 = Am_Value::Valid(new_loc), bVar1)) {
            Am_Inter_Location::operator=(&data,new_loc);
          }
          pAVar5 = Am_Object::Get(command_obj,0xdf,0);
          iVar4 = Am_Value::operator_cast_to_int(pAVar5);
          if (iVar4 < 2) {
LAB_001c75df:
            am_create_new_object
                      (&local_50,&inter,(Am_Inter_Location *)command_obj,(Am_Object *)&data,
                       SUB81(&orig_object,0));
            Am_Object::operator=(&new_object,&local_50);
            Am_Object::~Am_Object(&local_50);
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
            Am_Object::Set(command_obj,0x169,pAVar6,0);
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
            Am_Object::Set(command_obj,0x16d,pAVar6,0);
            pAVar5 = Am_Object::Get(command_obj,0x154,0);
            Am_Object::operator=(&impl_parent,pAVar5);
            bVar3 = Am_Object::Valid(&impl_parent);
            bVar1 = true;
            if (bVar3) {
              pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
              Am_Object::Set(&impl_parent,0x169,pAVar6,0);
              pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
              Am_Object::Set(&impl_parent,0x16d,pAVar6,0);
            }
          }
          else {
            pAVar5 = Am_Object::Get(&inter,0xd3,0);
            bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
            if ((!bVar1) || (bVar1 = Am_Inter_Location::Is_Zero_Size(&data), !bVar1))
            goto LAB_001c75df;
            Am_Object::Set(command_obj,0x166,true,1);
            Am_Object::Am_Object(&local_48,&Am_No_Object);
            Am_Beep(&local_48);
            Am_Object::~Am_Object(&local_48);
            bVar1 = false;
          }
          Am_Inter_Location::~Am_Inter_Location(&data);
          bVar3 = bVar1;
        }
        else {
          bVar1 = true;
          bVar3 = false;
        }
        Am_Object::~Am_Object(&impl_parent);
        Am_Object::~Am_Object(&orig_object);
        if (bVar1 == false) goto LAB_001c74c4;
        goto LAB_001c74ad;
      }
    }
    bVar3 = false;
  }
LAB_001c74ad:
  Am_Object::Set(command_obj,0x16f,(bool)(bVar3 ^ 1),0);
LAB_001c74c4:
  Am_Object::~Am_Object(&owner);
  Am_Object::~Am_Object(&new_object);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

void
am_new_points_general_undo_redo(Am_Object command_obj, bool undo,
                                bool selective, bool reload_data,
                                Am_Object new_obj_proto,
                                const Am_Value &new_loc)
{
  Am_Object inter, new_object, owner;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  new_object = command_obj.Get(Am_VALUE);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " command " << command_obj << " on obj " << new_object
              << std::endl
              << std::flush;
  }
#endif

  //assume created object is always on top, so OK to undo it to the top
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);
  if (currently_undone) {
    if (new_object.Valid()) {
      //then put it back
      owner = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
      if (owner.Valid()) {
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Adding " << new_object << " back to owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Add_Part(new_object);
      }
    }
  } else {
    if (undo) {
      if (new_object.Valid()) {
        // remove it
        owner = new_object.Get_Owner();
        command_obj.Set(Am_SAVED_OLD_OBJECT_OWNER, owner, Am_OK_IF_NOT_THERE);
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Removing " << new_object << " from owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Remove_Part(new_object);
      }
    } else { // selective repeat, create a new object
      if (inter.Valid()) {
        Am_Object orig_object, impl_parent;
        if (reload_data && new_obj_proto.Valid()) {
          orig_object = new_obj_proto;
          command_obj.Set(Am_START_OBJECT, orig_object, Am_OK_IF_NOT_THERE);
        } else
          orig_object = command_obj.Get(Am_START_OBJECT);
        if (orig_object.Valid()) {
          // command_obj.Get(Am_INTERIM_VALUE);
          Am_Inter_Location data(orig_object);
          bool override = false;
          if (reload_data && new_loc.Valid()) {
            data = new_loc;
            override = true;
          }
          //if only one point, then size doesn't matter
          if ((int)command_obj.Get(Am_HOW_MANY_POINTS) >= 2) {
            bool beep_on_abort = inter.Get(Am_INTER_BEEP_ON_ABORT);
            if (beep_on_abort && data.Is_Zero_Size()) {
              Am_INTER_TRACE_PRINT(inter, "Aborting " << command_obj
                                                      << " because zero size");
              //not queued for undo
              command_obj.Set(Am_COMMAND_IS_ABORTING, true, Am_OK_IF_NOT_THERE);
              Am_Beep();
              return;
            }
          }
          new_object = am_create_new_object(inter, command_obj, data,
                                            orig_object, override);
          Am_INTER_TRACE_PRINT(inter, "++Created new object " << new_object
                                                              << " at location "
                                                              << data);
          command_obj.Set(Am_VALUE, new_object);
          command_obj.Set(Am_OBJECT_MODIFIED, new_object);
          impl_parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
          if (impl_parent.Valid()) {
            impl_parent.Set(Am_VALUE, new_object);
            impl_parent.Set(Am_OBJECT_MODIFIED, new_object);
          }
          currently_undone = true; //so set below will make it false
        }
      }
    }
  }
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}